

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.c
# Opt level: O2

void av1_cdef_copy_sb8_16
               (AV1_COMMON *cm,uint16_t *dst,int dstride,uint8_t *src,int src_voffset,
               int src_hoffset,int sstride,int vsize,int hsize)

{
  uint16_t *puVar1;
  _func_void_uint16_t_ptr_int_uint16_t_ptr_int_int_int **pp_Var2;
  
  if (cm->seq_params->use_highbitdepth == '\0') {
    puVar1 = (uint16_t *)(src + (long)sstride * (long)src_voffset + (long)src_hoffset);
    pp_Var2 = (_func_void_uint16_t_ptr_int_uint16_t_ptr_int_int_int **)
              &cdef_copy_rect8_8bit_to_16bit;
  }
  else {
    puVar1 = (uint16_t *)
             ((long)sstride * (long)src_voffset * 2 + (long)src * 2 + (long)src_hoffset * 2);
    pp_Var2 = &cdef_copy_rect8_16bit_to_16bit;
  }
  (**pp_Var2)(dst,dstride,puVar1,sstride,hsize,vsize);
  return;
}

Assistant:

void av1_cdef_copy_sb8_16(const AV1_COMMON *const cm, uint16_t *const dst,
                          int dstride, const uint8_t *src, int src_voffset,
                          int src_hoffset, int sstride, int vsize, int hsize) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (cm->seq_params->use_highbitdepth) {
    av1_cdef_copy_sb8_16_highbd(dst, dstride, src, src_voffset, src_hoffset,
                                sstride, vsize, hsize);
    return;
  }
#else
  (void)cm;
#endif  // CONFIG_AV1_HIGHBITDEPTH
  av1_cdef_copy_sb8_16_lowbd(dst, dstride, src, src_voffset, src_hoffset,
                             sstride, vsize, hsize);
}